

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O1

pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *
genPointPair<float>(pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
                    *__return_storage_ptr__,Matrix<float,_4,_4,_0,_4,_4> *T)

{
  int iVar1;
  ActualDstType actualDst;
  Matrix<float,_3,_1,_0,_3,_1> P;
  Matrix<float,_4,_1,_0,_4,_1> Q;
  float local_44;
  float local_40;
  float local_3c;
  Matrix<float,_4,_1,_0,_4,_1> local_38;
  Matrix<float,_4,_4,_0,_4,_4> *local_28;
  float *local_20;
  
  iVar1 = rand();
  local_44 = (((float)iVar1 + (float)iVar1) * 4.656613e-10 + -1.0) * 40.0;
  iVar1 = rand();
  local_40 = (((float)iVar1 + (float)iVar1) * 4.656613e-10 + -1.0) * 40.0;
  iVar1 = rand();
  local_3c = (((float)iVar1 + (float)iVar1) * 4.656613e-10 + -1.0) * 40.0;
  local_28 = T;
  local_20 = &local_44;
  Eigen::internal::
  homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
  ::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
            ((homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
              *)&local_28,&local_38);
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] = local_44;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = local_40;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] = local_3c;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = 1.0;
  *(undefined8 *)
   (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
   m_storage.m_data.array =
       local_38.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
       _0_8_;
  *(undefined8 *)
   ((__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array + 2) =
       local_38.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
       _8_8_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}